

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O2

size_t path_build(char *buf,size_t len,char *base,char *leaf)

{
  _Bool _Var1;
  size_t cur_len;
  size_t local_28;
  
  local_28 = 0;
  *buf = '\0';
  if ((leaf == (char *)0x0) || (*leaf == '\0')) {
    if (base == (char *)0x0) {
      return 0;
    }
    leaf = base;
    if (*base == '\0') {
      return 0;
    }
  }
  else if ((((base != (char *)0x0) && (*base != '\0')) && (_Var1 = prefix(leaf,"/"), !_Var1)) &&
          (*leaf != '~')) {
    path_process(buf,len,&local_28,base);
    _Var1 = suffix(base,"/");
    if (!_Var1) {
      strnfcat(buf,len,&local_28,"%s","/");
    }
  }
  path_process(buf,len,&local_28,leaf);
  return local_28;
}

Assistant:

size_t path_build(char *buf, size_t len, const char *base, const char *leaf)
{
	size_t cur_len = 0;
	int starts_with_separator;

	buf[0] = '\0';

	if (!leaf || !leaf[0]) {
		if (base && base[0])
			path_process(buf, len, &cur_len, base);

		return cur_len;
	}


	/*
	 * If the leafname starts with the separator,
	 *   or with the tilde (on Unix),
	 *   or there's no base path,
	 * We use the leafname only.
	 */
	starts_with_separator = (!base || !base[0]) || prefix(leaf, PATH_SEP);
#if defined(UNIX)
	starts_with_separator = starts_with_separator || leaf[0] == '~';
#endif
	if (starts_with_separator) {
		path_process(buf, len, &cur_len, leaf);
		return cur_len;
	}


	/* There is both a relative leafname and a base path from which it is
	 * relative */
	path_process(buf, len, &cur_len, base);

	if (!suffix(base, PATH_SEP)) {
		/* Append separator if it isn't already in the string. */
		strnfcat(buf, len, &cur_len, "%s", PATH_SEP);
	}

	path_process(buf, len, &cur_len, leaf);

	return cur_len;
}